

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_3,_3> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *mat)

{
  int col_1;
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  int ndx;
  undefined8 *puVar4;
  int ndx_2;
  Vector<float,_3> *pVVar5;
  long lVar6;
  tcu *this;
  Vector<float,_3> *pVVar7;
  Vector<float,_2> *pVVar8;
  bool bVar9;
  float v;
  float fVar10;
  float fVar11;
  Matrix<float,_1,_2> blockC;
  Matrix<float,_1,_2> matC;
  Matrix<float,_2,_1> matB;
  Matrix<float,_2,_1> res_1;
  Matrix<float,_2,_1> blockB;
  float result [9];
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> invA;
  Matrix<float,_2,_2> zeroMat;
  float nullField [4];
  float areaA [4];
  Matrix<float,_2,_1> local_108;
  Matrix<float,_1,_2> local_100;
  float local_f8 [6];
  Vector<float,_1> local_e0;
  Vector<float,_1> local_dc;
  Matrix<float,_2,_2> local_d8;
  Matrix<float,_2,_2> local_c8;
  undefined4 local_b8;
  float local_b4;
  Vector<tcu::Vector<float,_2>,_1> local_b0;
  float local_a8;
  tcu local_98 [4];
  float local_94;
  undefined4 local_8c;
  undefined1 local_88 [16];
  Vector<float,_2> local_78 [2];
  Matrix<float,_2,_2> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  pfVar1 = &local_48;
  local_48 = (mat->m_data).m_data[0].m_data[0];
  local_44 = (mat->m_data).m_data[1].m_data[0];
  local_40 = (mat->m_data).m_data[0].m_data[1];
  local_3c = (mat->m_data).m_data[1].m_data[1];
  local_f8[5] = (mat->m_data).m_data[2].m_data[0];
  local_f8[4] = (mat->m_data).m_data[2].m_data[1];
  local_dc.m_data[0] = (float  [1])(mat->m_data).m_data[0].m_data[2];
  local_e0.m_data[0] = (float  [1])(mat->m_data).m_data[1].m_data[2];
  fVar10 = (mat->m_data).m_data[2].m_data[2];
  local_58 = 0;
  uStack_50 = 0;
  pfVar3 = (float *)&local_c8;
  local_c8.m_data.m_data[0].m_data[0] = 0.0;
  local_c8.m_data.m_data[0].m_data[1] = 0.0;
  local_c8.m_data.m_data[1].m_data[0] = 0.0;
  local_c8.m_data.m_data[1].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = pfVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar1 = pfVar1 + 2;
    pfVar3 = pfVar3 + 1;
    bVar9 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar9);
  local_88._0_4_ = fVar10;
  pVVar8 = local_78;
  inverse<2>(&local_c8);
  lVar2 = 0;
  local_f8[1] = local_f8[4];
  local_f8[0] = local_f8[5];
  local_100.m_data.m_data[1].m_data[0] = local_e0.m_data[0];
  local_100.m_data.m_data[0].m_data[0] = local_dc.m_data[0];
  local_c8.m_data.m_data[0].m_data[0] = 0.0;
  local_c8.m_data.m_data[0].m_data[1] = 0.0;
  do {
    fVar10 = 1.0;
    if (lVar2 != 0) {
      fVar10 = 0.0;
    }
    local_c8.m_data.m_data[0].m_data[lVar2] = fVar10;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    fVar10 = 0.0;
    lVar6 = 0;
    do {
      fVar10 = fVar10 + local_100.m_data.m_data[lVar6].m_data[0] * pVVar8->m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_c8.m_data.m_data[0].m_data[lVar2] = fVar10;
    pVVar8 = pVVar8 + 1;
    bVar9 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar9);
  fVar10 = 0.0;
  lVar2 = 0;
  do {
    fVar10 = fVar10 + local_c8.m_data.m_data[0].m_data[lVar2] * local_f8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  pfVar3 = (float *)&local_68;
  local_68.m_data.m_data[0].m_data[0] = 0.0;
  local_68.m_data.m_data[0].m_data[1] = 0.0;
  local_68.m_data.m_data[1].m_data[0] = 0.0;
  local_68.m_data.m_data[1].m_data[1] = 0.0;
  puVar4 = &local_58;
  lVar2 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = (float)*(undefined4 *)((long)puVar4 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    puVar4 = puVar4 + 1;
    pfVar3 = pfVar3 + 1;
    bVar9 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar9);
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  lVar2 = 0;
  do {
    fVar11 = 1.0;
    if (lVar2 != 0) {
      fVar11 = 0.0;
    }
    local_f8[lVar2 + 2] = fVar11;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  pfVar3 = local_78[0].m_data;
  lVar2 = 0;
  do {
    fVar11 = 0.0;
    lVar6 = 0;
    do {
      fVar11 = fVar11 + pfVar3[lVar6 * 2] * local_f8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_f8[lVar2 + 2] = fVar11;
    pfVar3 = pfVar3 + 1;
    bVar9 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar9);
  local_108.m_data.m_data[0].m_data = (Vector<tcu::Vector<float,_2>,_1>)(Vector<float,_2>  [1])0x0;
  lVar2 = 0;
  do {
    fVar11 = 1.0;
    if (lVar2 != 0) {
      fVar11 = 0.0;
    }
    local_108.m_data.m_data[0].m_data[lVar2] = fVar11;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  fVar10 = 1.0 / ((float)local_88._0_4_ - fVar10);
  lVar2 = 0;
  do {
    local_108.m_data.m_data[0].m_data[lVar2] = local_f8[lVar2 + 2] * fVar10;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_88 = ZEXT416((uint)fVar10);
  tcu::operator*(&local_108,&local_100);
  pVVar8 = local_78;
  tcu::operator*((tcu *)&local_c8,&local_d8,(Matrix<float,_2,_2> *)pVVar8);
  tcu::operator+(local_98,(Matrix<float,_2,_2> *)pVVar8,&local_c8);
  this = (tcu *)&local_c8;
  tcu::operator-(this,&local_68,(Matrix<float,_2,_2> *)pVVar8);
  local_108.m_data.m_data[0].m_data = (Vector<tcu::Vector<float,_2>,_1>)(Vector<float,_2>  [1])0x0;
  lVar2 = 0;
  do {
    fVar10 = 1.0;
    if (lVar2 != 0) {
      fVar10 = 0.0;
    }
    local_108.m_data.m_data[0].m_data[lVar2] = fVar10;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    fVar10 = 0.0;
    lVar6 = 0;
    do {
      fVar10 = fVar10 + *(float *)(this + lVar6 * 8) * local_f8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_108.m_data.m_data[0].m_data[lVar2] = fVar10;
    this = this + 4;
    bVar9 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar9);
  local_d8.m_data.m_data[0].m_data[0] = 0.0;
  local_d8.m_data.m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar10 = 1.0;
    if (lVar2 != 0) {
      fVar10 = 0.0;
    }
    local_d8.m_data.m_data[0].m_data[lVar2] = fVar10;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    local_d8.m_data.m_data[0].m_data[lVar2] =
         local_108.m_data.m_data[0].m_data[lVar2] * (float)local_88._0_4_;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_c8.m_data.m_data[0].m_data[0] = 0.0;
  local_c8.m_data.m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar10 = 1.0;
    if (lVar2 != 0) {
      fVar10 = 0.0;
    }
    local_c8.m_data.m_data[0].m_data[lVar2] = fVar10;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    fVar10 = 0.0;
    lVar6 = 0;
    do {
      fVar10 = fVar10 + local_100.m_data.m_data[lVar6].m_data[0] *
                        ((Vector<tcu::Vector<float,_2>,_2> *)pVVar8->m_data)->m_data[0].m_data
                        [lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    local_c8.m_data.m_data[0].m_data[lVar2] = fVar10;
    pVVar8 = pVVar8 + 1;
    bVar9 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar9);
  local_108.m_data.m_data[0].m_data = (Vector<tcu::Vector<float,_2>,_1>)(Vector<float,_2>  [1])0x0;
  lVar2 = 0;
  do {
    fVar10 = 1.0;
    if (lVar2 != 0) {
      fVar10 = 0.0;
    }
    local_108.m_data.m_data[0].m_data[lVar2] = fVar10;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    local_108.m_data.m_data[0].m_data[lVar2] =
         local_c8.m_data.m_data[0].m_data[lVar2] * -(float)local_88._0_4_;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  pfVar3 = (float *)&local_c8;
  local_c8.m_data.m_data[1].m_data[0] = local_d8.m_data.m_data[0].m_data[0];
  local_c8.m_data.m_data[1].m_data[1] = local_94;
  local_b8 = local_8c;
  local_b4 = local_d8.m_data.m_data[0].m_data[1];
  local_b0.m_data[0].m_data =
       (Vector<float,_2>  [1])(Vector<float,_2>  [1])local_108.m_data.m_data[0].m_data;
  local_a8 = (float)local_88._0_4_;
  pVVar7 = (__return_storage_ptr__->m_data).m_data;
  pVVar7[1].m_data[1] = 0.0;
  pVVar7[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar2 = 0;
  pVVar7 = (Vector<float,_3> *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    pVVar5 = pVVar7;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] = pfVar3[lVar6];
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar6 != 3);
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 3;
    pVVar7 = (Vector<float,_3> *)(pVVar7->m_data + 1);
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 3, 3> inverse<3> (const tcu::Matrix<float, 3, 3>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2] =
	{
		mat(0,2),
		mat(1,2),
	};
	const float areaC[2] =
	{
		mat(2,0),	mat(2,1),
	};
	const float areaD[1] =
	{
		mat(2,2)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2>	invA = inverse(tcu::Matrix<float, 2, 2>(areaA));
	const tcu::Matrix<float, 2, 1>	matB =         tcu::Matrix<float, 2, 1>(areaB);
	const tcu::Matrix<float, 1, 2>	matC =         tcu::Matrix<float, 1, 2>(areaC);
	const tcu::Matrix<float, 1, 1>	matD =         tcu::Matrix<float, 1, 1>(areaD);

	const float						schurComplement = 1.0f / (matD - matC*invA*matB)(0,0);
	const tcu::Matrix<float, 2, 2>	zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2>	blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 1>	blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 1, 2>	blockC = matC*invA*(-schurComplement);
	const float						blockD = schurComplement;

	const float result[3*3] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),
		blockA(1,0),	blockA(1,1),	blockB(1,0),
		blockC(0,0),	blockC(0,1),	blockD,
	};

	return Mat3(result);
}